

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
          *this,SCC **k)

{
  iterator iter;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
  *res;
  tuple<const_google::protobuf::compiler::SCC_*const_&> local_30;
  ctrl_t *local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  SCC **local_18;
  SCC **k_local;
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (SCC **)this;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
  ::find_or_prepare_insert<google::protobuf::compiler::SCC_const*>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
              *)this,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_28 = (__return_storage_ptr__->first).ctrl_;
    local_20 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<google::protobuf::compiler::SCC_const*const&>((SCC **)&local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_20.slot_;
    iter.ctrl_ = local_28;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::compiler::SCC_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_30,
               (tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }